

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O2

uint32_t blockmix_xor_save(salsa20_blk_t *Bin1,salsa20_blk_t *Bin2,salsa20_blk_t *Bout,size_t r,
                          pwxform_ctx_t *ctx)

{
  salsa20_blk_t *psVar1;
  salsa20_blk_t *psVar2;
  uint32_t *puVar3;
  int *piVar4;
  uint8_t *puVar5;
  long lVar6;
  uint8_t *puVar7;
  size_t sVar8;
  ulong uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint8_t *puVar12;
  bool bVar13;
  __m128i Y2;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i Y1;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i Y3;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  int iVar73;
  int iVar74;
  __m128i Y0;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar75;
  int iVar76;
  int iVar96;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar97;
  uint uVar111;
  uint uVar112;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  uint uVar114;
  uint32_t uVar115;
  uint uVar128;
  uint uVar129;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  uint uVar131;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  int iVar130;
  int iVar132;
  undefined1 auVar127 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  int iVar138;
  int iVar141;
  int iVar142;
  undefined1 auVar139 [16];
  int iVar143;
  undefined1 auVar140 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  
  sVar8 = ctx->w;
  lVar6 = r * 2 + -1;
  psVar1 = Bin2 + lVar6;
  psVar2 = Bin1 + lVar6;
  do {
    bVar13 = lVar6 != 0;
    lVar6 = lVar6 + -1;
  } while (bVar13);
  auVar59 = (undefined1  [16])psVar1->q[0] ^ (undefined1  [16])psVar2->q[0];
  auVar26 = (undefined1  [16])psVar1->q[1] ^ (undefined1  [16])psVar2->q[1];
  auVar14 = (undefined1  [16])psVar1->q[2] ^ (undefined1  [16])psVar2->q[2];
  auVar42 = (undefined1  [16])psVar1->q[3] ^ (undefined1  [16])psVar2->q[3];
  lVar6 = 0x70;
  uVar9 = 0;
  puVar5 = ctx->S0;
  puVar7 = ctx->S2;
  puVar12 = ctx->S1;
  while( true ) {
    puVar10 = puVar7;
    puVar7 = puVar5;
    auVar116 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x70) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x70);
    auVar133 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x60) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x60);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x70) = auVar116;
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x60) = auVar133;
    auVar98 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x50) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x50);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x50) = auVar98;
    auVar77 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x40) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x40);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x40) = auVar77;
    auVar116 = auVar116 ^ auVar59;
    uVar97 = auVar116._4_4_;
    auVar60._4_4_ = uVar97;
    auVar60._0_4_ = uVar97;
    auVar60._8_4_ = auVar116._12_4_;
    auVar60._12_4_ = auVar116._12_4_;
    auVar61._0_8_ =
         (ulong)uVar97 * (ulong)auVar116._0_4_ + *(long *)(puVar7 + (auVar116._0_8_ & 0xff0));
    auVar61._8_8_ =
         (auVar60._8_8_ & 0xffffffff) * (ulong)auVar116._8_4_ +
         *(long *)((long)(puVar7 + (auVar116._0_8_ & 0xff0)) + 8);
    auVar61 = auVar61 ^ *(undefined1 (*) [16])(puVar12 + (auVar116._0_8_ >> 0x20 & 0xff0));
    auVar133 = auVar133 ^ auVar26;
    uVar97 = auVar133._4_4_;
    auVar117._4_4_ = uVar97;
    auVar117._0_4_ = uVar97;
    auVar117._8_4_ = auVar133._12_4_;
    auVar117._12_4_ = auVar133._12_4_;
    auVar118._0_8_ =
         (ulong)uVar97 * (ulong)auVar133._0_4_ + *(long *)(puVar7 + (auVar133._0_8_ & 0xff0));
    auVar118._8_8_ =
         (auVar117._8_8_ & 0xffffffff) * (ulong)auVar133._8_4_ +
         *(long *)((long)(puVar7 + (auVar133._0_8_ & 0xff0)) + 8);
    auVar118 = auVar118 ^ *(undefined1 (*) [16])(puVar12 + (auVar133._0_8_ >> 0x20 & 0xff0));
    auVar98 = auVar98 ^ auVar14;
    uVar97 = auVar98._4_4_;
    auVar134._4_4_ = uVar97;
    auVar134._0_4_ = uVar97;
    auVar134._8_4_ = auVar98._12_4_;
    auVar134._12_4_ = auVar98._12_4_;
    auVar135._0_8_ =
         (ulong)uVar97 * (ulong)auVar98._0_4_ + *(long *)(puVar7 + (auVar98._0_8_ & 0xff0));
    auVar135._8_8_ =
         (auVar134._8_8_ & 0xffffffff) * (ulong)auVar98._8_4_ +
         *(long *)((long)(puVar7 + (auVar98._0_8_ & 0xff0)) + 8);
    auVar135 = auVar135 ^ *(undefined1 (*) [16])(puVar12 + (auVar98._0_8_ >> 0x20 & 0xff0));
    auVar77 = auVar77 ^ auVar42;
    uVar97 = auVar77._4_4_;
    auVar99._4_4_ = uVar97;
    auVar99._0_4_ = uVar97;
    auVar99._8_4_ = auVar77._12_4_;
    auVar99._12_4_ = auVar77._12_4_;
    auVar100._0_8_ =
         (ulong)uVar97 * (ulong)auVar77._0_4_ + *(long *)(puVar7 + (auVar77._0_8_ & 0xff0));
    auVar100._8_8_ =
         (auVar99._8_8_ & 0xffffffff) * (ulong)auVar77._8_4_ +
         *(long *)((long)(puVar7 + (auVar77._0_8_ & 0xff0)) + 8);
    auVar100 = auVar100 ^ *(undefined1 (*) [16])(puVar12 + (auVar77._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar61._4_4_;
    auVar77._4_4_ = uVar97;
    auVar77._0_4_ = uVar97;
    auVar77._8_4_ = auVar61._12_4_;
    auVar77._12_4_ = auVar61._12_4_;
    auVar98._0_8_ =
         (ulong)uVar97 * (ulong)auVar61._0_4_ + *(long *)(puVar7 + (auVar61._0_8_ & 0xff0));
    auVar98._8_8_ =
         (auVar77._8_8_ & 0xffffffff) * (ulong)auVar61._8_4_ +
         *(long *)((long)(puVar7 + (auVar61._0_8_ & 0xff0)) + 8);
    auVar98 = auVar98 ^ *(undefined1 (*) [16])(puVar12 + (auVar61._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar118._4_4_;
    auVar27._4_4_ = uVar97;
    auVar27._0_4_ = uVar97;
    auVar27._8_4_ = auVar118._12_4_;
    auVar27._12_4_ = auVar118._12_4_;
    auVar28._0_8_ =
         (ulong)uVar97 * (ulong)auVar118._0_4_ + *(long *)(puVar7 + (auVar118._0_8_ & 0xff0));
    auVar28._8_8_ =
         (auVar27._8_8_ & 0xffffffff) * (ulong)auVar118._8_4_ +
         *(long *)((long)(puVar7 + (auVar118._0_8_ & 0xff0)) + 8);
    auVar28 = auVar28 ^ *(undefined1 (*) [16])(puVar12 + (auVar118._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar135._4_4_;
    auVar43._4_4_ = uVar97;
    auVar43._0_4_ = uVar97;
    auVar43._8_4_ = auVar135._12_4_;
    auVar43._12_4_ = auVar135._12_4_;
    auVar44._0_8_ =
         (ulong)uVar97 * (ulong)auVar135._0_4_ + *(long *)(puVar7 + (auVar135._0_8_ & 0xff0));
    auVar44._8_8_ =
         (auVar43._8_8_ & 0xffffffff) * (ulong)auVar135._8_4_ +
         *(long *)((long)(puVar7 + (auVar135._0_8_ & 0xff0)) + 8);
    auVar44 = auVar44 ^ *(undefined1 (*) [16])(puVar12 + (auVar135._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar100._4_4_;
    auVar62._4_4_ = uVar97;
    auVar62._0_4_ = uVar97;
    auVar62._8_4_ = auVar100._12_4_;
    auVar62._12_4_ = auVar100._12_4_;
    auVar63._0_8_ =
         (ulong)uVar97 * (ulong)auVar100._0_4_ + *(long *)(puVar7 + (auVar100._0_8_ & 0xff0));
    auVar63._8_8_ =
         (auVar62._8_8_ & 0xffffffff) * (ulong)auVar100._8_4_ +
         *(long *)((long)(puVar7 + (auVar100._0_8_ & 0xff0)) + 8);
    auVar63 = auVar63 ^ *(undefined1 (*) [16])(puVar12 + (auVar100._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8) = auVar98;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x10) = auVar28;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x20) = auVar44;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x30) = auVar63;
    uVar97 = auVar98._4_4_;
    auVar78._4_4_ = uVar97;
    auVar78._0_4_ = uVar97;
    auVar78._8_4_ = auVar98._12_4_;
    auVar78._12_4_ = auVar98._12_4_;
    auVar79._0_8_ =
         (ulong)uVar97 * (ulong)auVar98._0_4_ + *(long *)(puVar7 + (auVar98._0_8_ & 0xff0));
    auVar79._8_8_ =
         (auVar78._8_8_ & 0xffffffff) * (ulong)auVar98._8_4_ +
         *(long *)((long)(puVar7 + (auVar98._0_8_ & 0xff0)) + 8);
    auVar79 = auVar79 ^ *(undefined1 (*) [16])(puVar12 + (auVar98._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar28._4_4_;
    auVar116._4_4_ = uVar97;
    auVar116._0_4_ = uVar97;
    auVar116._8_4_ = auVar28._12_4_;
    auVar116._12_4_ = auVar28._12_4_;
    auVar133._0_8_ =
         (ulong)uVar97 * (ulong)auVar28._0_4_ + *(long *)(puVar7 + (auVar28._0_8_ & 0xff0));
    auVar133._8_8_ =
         (auVar116._8_8_ & 0xffffffff) * (ulong)auVar28._8_4_ +
         *(long *)((long)(puVar7 + (auVar28._0_8_ & 0xff0)) + 8);
    auVar133 = auVar133 ^ *(undefined1 (*) [16])(puVar12 + (auVar28._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar44._4_4_;
    auVar29._4_4_ = uVar97;
    auVar29._0_4_ = uVar97;
    auVar29._8_4_ = auVar44._12_4_;
    auVar29._12_4_ = auVar44._12_4_;
    auVar30._0_8_ =
         (ulong)uVar97 * (ulong)auVar44._0_4_ + *(long *)(puVar7 + (auVar44._0_8_ & 0xff0));
    auVar30._8_8_ =
         (auVar29._8_8_ & 0xffffffff) * (ulong)auVar44._8_4_ +
         *(long *)((long)(puVar7 + (auVar44._0_8_ & 0xff0)) + 8);
    auVar30 = auVar30 ^ *(undefined1 (*) [16])(puVar12 + (auVar44._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar63._4_4_;
    auVar45._4_4_ = uVar97;
    auVar45._0_4_ = uVar97;
    auVar45._8_4_ = auVar63._12_4_;
    auVar45._12_4_ = auVar63._12_4_;
    auVar46._0_8_ =
         (ulong)uVar97 * (ulong)auVar63._0_4_ + *(long *)(puVar7 + (auVar63._0_8_ & 0xff0));
    auVar46._8_8_ =
         (auVar45._8_8_ & 0xffffffff) * (ulong)auVar63._8_4_ +
         *(long *)((long)(puVar7 + (auVar63._0_8_ & 0xff0)) + 8);
    auVar46 = auVar46 ^ *(undefined1 (*) [16])(puVar12 + (auVar63._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x40) = auVar79;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x50) = auVar133;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x60) = auVar30;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x70) = auVar46;
    uVar97 = auVar79._4_4_;
    auVar64._4_4_ = uVar97;
    auVar64._0_4_ = uVar97;
    auVar64._8_4_ = auVar79._12_4_;
    auVar64._12_4_ = auVar79._12_4_;
    auVar65._0_8_ =
         (ulong)uVar97 * (ulong)auVar79._0_4_ + *(long *)(puVar7 + (auVar79._0_8_ & 0xff0));
    auVar65._8_8_ =
         (auVar64._8_8_ & 0xffffffff) * (ulong)auVar79._8_4_ +
         *(long *)((long)(puVar7 + (auVar79._0_8_ & 0xff0)) + 8);
    auVar65 = auVar65 ^ *(undefined1 (*) [16])(puVar12 + (auVar79._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar133._4_4_;
    auVar80._4_4_ = uVar97;
    auVar80._0_4_ = uVar97;
    auVar80._8_4_ = auVar133._12_4_;
    auVar80._12_4_ = auVar133._12_4_;
    auVar81._0_8_ =
         (ulong)uVar97 * (ulong)auVar133._0_4_ + *(long *)(puVar7 + (auVar133._0_8_ & 0xff0));
    auVar81._8_8_ =
         (auVar80._8_8_ & 0xffffffff) * (ulong)auVar133._8_4_ +
         *(long *)((long)(puVar7 + (auVar133._0_8_ & 0xff0)) + 8);
    auVar81 = auVar81 ^ *(undefined1 (*) [16])(puVar12 + (auVar133._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar30._4_4_;
    auVar101._4_4_ = uVar97;
    auVar101._0_4_ = uVar97;
    auVar101._8_4_ = auVar30._12_4_;
    auVar101._12_4_ = auVar30._12_4_;
    auVar102._0_8_ =
         (ulong)uVar97 * (ulong)auVar30._0_4_ + *(long *)(puVar7 + (auVar30._0_8_ & 0xff0));
    auVar102._8_8_ =
         (auVar101._8_8_ & 0xffffffff) * (ulong)auVar30._8_4_ +
         *(long *)((long)(puVar7 + (auVar30._0_8_ & 0xff0)) + 8);
    auVar102 = auVar102 ^ *(undefined1 (*) [16])(puVar12 + (auVar30._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar46._4_4_;
    auVar119._4_4_ = uVar97;
    auVar119._0_4_ = uVar97;
    auVar119._8_4_ = auVar46._12_4_;
    auVar119._12_4_ = auVar46._12_4_;
    auVar120._0_8_ =
         (ulong)uVar97 * (ulong)auVar46._0_4_ + *(long *)(puVar7 + (auVar46._0_8_ & 0xff0));
    auVar120._8_8_ =
         (auVar119._8_8_ & 0xffffffff) * (ulong)auVar46._8_4_ +
         *(long *)((long)(puVar7 + (auVar46._0_8_ & 0xff0)) + 8);
    auVar120 = auVar120 ^ *(undefined1 (*) [16])(puVar12 + (auVar46._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x80) = auVar65;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x90) = auVar81;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xa0) = auVar102;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xb0) = auVar120;
    uVar97 = auVar65._4_4_;
    auVar15._4_4_ = uVar97;
    auVar15._0_4_ = uVar97;
    auVar15._8_4_ = auVar65._12_4_;
    auVar15._12_4_ = auVar65._12_4_;
    auVar16._0_8_ =
         (ulong)uVar97 * (ulong)auVar65._0_4_ + *(long *)(puVar7 + (auVar65._0_8_ & 0xff0));
    auVar16._8_8_ =
         (auVar15._8_8_ & 0xffffffff) * (ulong)auVar65._8_4_ +
         *(long *)((long)(puVar7 + (auVar65._0_8_ & 0xff0)) + 8);
    auVar16 = auVar16 ^ *(undefined1 (*) [16])(puVar12 + (auVar65._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar81._4_4_;
    auVar31._4_4_ = uVar97;
    auVar31._0_4_ = uVar97;
    auVar31._8_4_ = auVar81._12_4_;
    auVar31._12_4_ = auVar81._12_4_;
    auVar32._0_8_ =
         (ulong)uVar97 * (ulong)auVar81._0_4_ + *(long *)(puVar7 + (auVar81._0_8_ & 0xff0));
    auVar32._8_8_ =
         (auVar31._8_8_ & 0xffffffff) * (ulong)auVar81._8_4_ +
         *(long *)((long)(puVar7 + (auVar81._0_8_ & 0xff0)) + 8);
    auVar32 = auVar32 ^ *(undefined1 (*) [16])(puVar12 + (auVar81._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar102._4_4_;
    auVar66._4_4_ = uVar97;
    auVar66._0_4_ = uVar97;
    auVar66._8_4_ = auVar102._12_4_;
    auVar66._12_4_ = auVar102._12_4_;
    auVar67._0_8_ =
         (ulong)uVar97 * (ulong)auVar102._0_4_ + *(long *)(puVar7 + (auVar102._0_8_ & 0xff0));
    auVar67._8_8_ =
         (auVar66._8_8_ & 0xffffffff) * (ulong)auVar102._8_4_ +
         *(long *)((long)(puVar7 + (auVar102._0_8_ & 0xff0)) + 8);
    auVar67 = auVar67 ^ *(undefined1 (*) [16])(puVar12 + (auVar102._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar120._4_4_;
    auVar103._4_4_ = uVar97;
    auVar103._0_4_ = uVar97;
    auVar103._8_4_ = auVar120._12_4_;
    auVar103._12_4_ = auVar120._12_4_;
    auVar104._0_8_ =
         (ulong)uVar97 * (ulong)auVar120._0_4_ + *(long *)(puVar7 + (auVar120._0_8_ & 0xff0));
    auVar104._8_8_ =
         (auVar103._8_8_ & 0xffffffff) * (ulong)auVar120._8_4_ +
         *(long *)((long)(puVar7 + (auVar120._0_8_ & 0xff0)) + 8);
    auVar104 = auVar104 ^ *(undefined1 (*) [16])(puVar12 + (auVar120._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xc0) = auVar16;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xd0) = auVar32;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xe0) = auVar67;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xf0) = auVar104;
    uVar97 = auVar16._4_4_;
    auVar82._4_4_ = uVar97;
    auVar82._0_4_ = uVar97;
    auVar82._8_4_ = auVar16._12_4_;
    auVar82._12_4_ = auVar16._12_4_;
    auVar83._0_8_ =
         (ulong)uVar97 * (ulong)auVar16._0_4_ + *(long *)(puVar7 + (auVar16._0_8_ & 0xff0));
    auVar83._8_8_ =
         (auVar82._8_8_ & 0xffffffff) * (ulong)auVar16._8_4_ +
         *(long *)((long)(puVar7 + (auVar16._0_8_ & 0xff0)) + 8);
    auVar14 = *(undefined1 (*) [16])(puVar12 + (auVar16._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar32._4_4_;
    auVar47._4_4_ = uVar97;
    auVar47._0_4_ = uVar97;
    auVar47._8_4_ = auVar32._12_4_;
    auVar47._12_4_ = auVar32._12_4_;
    auVar48._0_8_ =
         (ulong)uVar97 * (ulong)auVar32._0_4_ + *(long *)(puVar7 + (auVar32._0_8_ & 0xff0));
    auVar48._8_8_ =
         (auVar47._8_8_ & 0xffffffff) * (ulong)auVar32._8_4_ +
         *(long *)((long)(puVar7 + (auVar32._0_8_ & 0xff0)) + 8);
    auVar26 = *(undefined1 (*) [16])(puVar12 + (auVar32._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar67._4_4_;
    auVar33._4_4_ = uVar97;
    auVar33._0_4_ = uVar97;
    auVar33._8_4_ = auVar67._12_4_;
    auVar33._12_4_ = auVar67._12_4_;
    auVar34._0_8_ =
         (ulong)uVar97 * (ulong)auVar67._0_4_ + *(long *)(puVar7 + (auVar67._0_8_ & 0xff0));
    auVar34._8_8_ =
         (auVar33._8_8_ & 0xffffffff) * (ulong)auVar67._8_4_ +
         *(long *)((long)(puVar7 + (auVar67._0_8_ & 0xff0)) + 8);
    auVar42 = *(undefined1 (*) [16])(puVar12 + (auVar67._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar104._4_4_;
    auVar17._4_4_ = uVar97;
    auVar17._0_4_ = uVar97;
    auVar17._8_4_ = auVar104._12_4_;
    auVar17._12_4_ = auVar104._12_4_;
    auVar18._0_8_ =
         (ulong)uVar97 * (ulong)auVar104._0_4_ + *(long *)(puVar7 + (auVar104._0_8_ & 0xff0));
    auVar18._8_8_ =
         (auVar17._8_8_ & 0xffffffff) * (ulong)auVar104._8_4_ +
         *(long *)((long)(puVar7 + (auVar104._0_8_ & 0xff0)) + 8);
    auVar59 = *(undefined1 (*) [16])(puVar12 + (auVar104._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x70) = auVar83 ^ auVar14;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x60) = auVar48 ^ auVar26;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x50) = auVar34 ^ auVar42;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x40) = auVar18 ^ auVar59;
    auVar133 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x30) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x30);
    auVar116 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x20) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x20);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x30) = auVar133;
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x20) = auVar116;
    auVar98 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x10) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x10);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x10) = auVar98;
    auVar77 = *(undefined1 (*) [16])((long)Bin2 + lVar6) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6);
    *(undefined1 (*) [16])((long)Bin2 + lVar6) = auVar77;
    auVar133 = auVar133 ^ auVar83 ^ auVar14;
    uVar97 = auVar133._4_4_;
    auVar84._4_4_ = uVar97;
    auVar84._0_4_ = uVar97;
    auVar84._8_4_ = auVar133._12_4_;
    auVar84._12_4_ = auVar133._12_4_;
    auVar85._0_8_ =
         (ulong)uVar97 * (ulong)auVar133._0_4_ + *(long *)(puVar10 + (auVar133._0_8_ & 0xff0));
    auVar85._8_8_ =
         (auVar84._8_8_ & 0xffffffff) * (ulong)auVar133._8_4_ +
         *(long *)((long)(puVar10 + (auVar133._0_8_ & 0xff0)) + 8);
    auVar85 = auVar85 ^ *(undefined1 (*) [16])(puVar7 + (auVar133._0_8_ >> 0x20 & 0xff0));
    auVar116 = auVar116 ^ auVar48 ^ auVar26;
    uVar97 = auVar116._4_4_;
    auVar49._4_4_ = uVar97;
    auVar49._0_4_ = uVar97;
    auVar49._8_4_ = auVar116._12_4_;
    auVar49._12_4_ = auVar116._12_4_;
    auVar50._0_8_ =
         (ulong)uVar97 * (ulong)auVar116._0_4_ + *(long *)(puVar10 + (auVar116._0_8_ & 0xff0));
    auVar50._8_8_ =
         (auVar49._8_8_ & 0xffffffff) * (ulong)auVar116._8_4_ +
         *(long *)((long)(puVar10 + (auVar116._0_8_ & 0xff0)) + 8);
    auVar50 = auVar50 ^ *(undefined1 (*) [16])(puVar7 + (auVar116._0_8_ >> 0x20 & 0xff0));
    auVar98 = auVar98 ^ auVar34 ^ auVar42;
    uVar97 = auVar98._4_4_;
    auVar121._4_4_ = uVar97;
    auVar121._0_4_ = uVar97;
    auVar121._8_4_ = auVar98._12_4_;
    auVar121._12_4_ = auVar98._12_4_;
    auVar122._0_8_ =
         (ulong)uVar97 * (ulong)auVar98._0_4_ + *(long *)(puVar10 + (auVar98._0_8_ & 0xff0));
    auVar122._8_8_ =
         (auVar121._8_8_ & 0xffffffff) * (ulong)auVar98._8_4_ +
         *(long *)((long)(puVar10 + (auVar98._0_8_ & 0xff0)) + 8);
    auVar122 = auVar122 ^ *(undefined1 (*) [16])(puVar7 + (auVar98._0_8_ >> 0x20 & 0xff0));
    auVar77 = auVar77 ^ auVar18 ^ auVar59;
    uVar97 = auVar77._4_4_;
    auVar105._4_4_ = uVar97;
    auVar105._0_4_ = uVar97;
    auVar105._8_4_ = auVar77._12_4_;
    auVar105._12_4_ = auVar77._12_4_;
    auVar106._0_8_ =
         (ulong)uVar97 * (ulong)auVar77._0_4_ + *(long *)(puVar10 + (auVar77._0_8_ & 0xff0));
    auVar106._8_8_ =
         (auVar105._8_8_ & 0xffffffff) * (ulong)auVar77._8_4_ +
         *(long *)((long)(puVar10 + (auVar77._0_8_ & 0xff0)) + 8);
    auVar106 = auVar106 ^ *(undefined1 (*) [16])(puVar7 + (auVar77._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar85._4_4_;
    auVar19._4_4_ = uVar97;
    auVar19._0_4_ = uVar97;
    auVar19._8_4_ = auVar85._12_4_;
    auVar19._12_4_ = auVar85._12_4_;
    auVar20._0_8_ =
         (ulong)uVar97 * (ulong)auVar85._0_4_ + *(long *)(puVar10 + (auVar85._0_8_ & 0xff0));
    auVar20._8_8_ =
         (auVar19._8_8_ & 0xffffffff) * (ulong)auVar85._8_4_ +
         *(long *)((long)(puVar10 + (auVar85._0_8_ & 0xff0)) + 8);
    auVar20 = auVar20 ^ *(undefined1 (*) [16])(puVar7 + (auVar85._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar50._4_4_;
    auVar35._4_4_ = uVar97;
    auVar35._0_4_ = uVar97;
    auVar35._8_4_ = auVar50._12_4_;
    auVar35._12_4_ = auVar50._12_4_;
    auVar36._0_8_ =
         (ulong)uVar97 * (ulong)auVar50._0_4_ + *(long *)(puVar10 + (auVar50._0_8_ & 0xff0));
    auVar36._8_8_ =
         (auVar35._8_8_ & 0xffffffff) * (ulong)auVar50._8_4_ +
         *(long *)((long)(puVar10 + (auVar50._0_8_ & 0xff0)) + 8);
    auVar36 = auVar36 ^ *(undefined1 (*) [16])(puVar7 + (auVar50._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar122._4_4_;
    auVar51._4_4_ = uVar97;
    auVar51._0_4_ = uVar97;
    auVar51._8_4_ = auVar122._12_4_;
    auVar51._12_4_ = auVar122._12_4_;
    auVar52._0_8_ =
         (ulong)uVar97 * (ulong)auVar122._0_4_ + *(long *)(puVar10 + (auVar122._0_8_ & 0xff0));
    auVar52._8_8_ =
         (auVar51._8_8_ & 0xffffffff) * (ulong)auVar122._8_4_ +
         *(long *)((long)(puVar10 + (auVar122._0_8_ & 0xff0)) + 8);
    auVar52 = auVar52 ^ *(undefined1 (*) [16])(puVar7 + (auVar122._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar106._4_4_;
    auVar68._4_4_ = uVar97;
    auVar68._0_4_ = uVar97;
    auVar68._8_4_ = auVar106._12_4_;
    auVar68._12_4_ = auVar106._12_4_;
    auVar69._0_8_ =
         (ulong)uVar97 * (ulong)auVar106._0_4_ + *(long *)(puVar10 + (auVar106._0_8_ & 0xff0));
    auVar69._8_8_ =
         (auVar68._8_8_ & 0xffffffff) * (ulong)auVar106._8_4_ +
         *(long *)((long)(puVar10 + (auVar106._0_8_ & 0xff0)) + 8);
    auVar69 = auVar69 ^ *(undefined1 (*) [16])(puVar7 + (auVar106._0_8_ >> 0x20 & 0xff0));
    uVar11 = (ulong)((int)sVar8 + 0x100U & 0xff0);
    *(undefined1 (*) [16])(puVar12 + uVar11) = auVar20;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x10) = auVar36;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x20) = auVar52;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x30) = auVar69;
    uVar97 = auVar20._4_4_;
    auVar86._4_4_ = uVar97;
    auVar86._0_4_ = uVar97;
    auVar86._8_4_ = auVar20._12_4_;
    auVar86._12_4_ = auVar20._12_4_;
    auVar87._0_8_ =
         (ulong)uVar97 * (ulong)auVar20._0_4_ + *(long *)(puVar10 + (auVar20._0_8_ & 0xff0));
    auVar87._8_8_ =
         (auVar86._8_8_ & 0xffffffff) * (ulong)auVar20._8_4_ +
         *(long *)((long)(puVar10 + (auVar20._0_8_ & 0xff0)) + 8);
    auVar87 = auVar87 ^ *(undefined1 (*) [16])(puVar7 + (auVar20._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar36._4_4_;
    auVar21._4_4_ = uVar97;
    auVar21._0_4_ = uVar97;
    auVar21._8_4_ = auVar36._12_4_;
    auVar21._12_4_ = auVar36._12_4_;
    auVar22._0_8_ =
         (ulong)uVar97 * (ulong)auVar36._0_4_ + *(long *)(puVar10 + (auVar36._0_8_ & 0xff0));
    auVar22._8_8_ =
         (auVar21._8_8_ & 0xffffffff) * (ulong)auVar36._8_4_ +
         *(long *)((long)(puVar10 + (auVar36._0_8_ & 0xff0)) + 8);
    auVar22 = auVar22 ^ *(undefined1 (*) [16])(puVar7 + (auVar36._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar52._4_4_;
    auVar37._4_4_ = uVar97;
    auVar37._0_4_ = uVar97;
    auVar37._8_4_ = auVar52._12_4_;
    auVar37._12_4_ = auVar52._12_4_;
    auVar38._0_8_ =
         (ulong)uVar97 * (ulong)auVar52._0_4_ + *(long *)(puVar10 + (auVar52._0_8_ & 0xff0));
    auVar38._8_8_ =
         (auVar37._8_8_ & 0xffffffff) * (ulong)auVar52._8_4_ +
         *(long *)((long)(puVar10 + (auVar52._0_8_ & 0xff0)) + 8);
    auVar38 = auVar38 ^ *(undefined1 (*) [16])(puVar7 + (auVar52._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar69._4_4_;
    auVar53._4_4_ = uVar97;
    auVar53._0_4_ = uVar97;
    auVar53._8_4_ = auVar69._12_4_;
    auVar53._12_4_ = auVar69._12_4_;
    auVar54._0_8_ =
         (ulong)uVar97 * (ulong)auVar69._0_4_ + *(long *)(puVar10 + (auVar69._0_8_ & 0xff0));
    auVar54._8_8_ =
         (auVar53._8_8_ & 0xffffffff) * (ulong)auVar69._8_4_ +
         *(long *)((long)(puVar10 + (auVar69._0_8_ & 0xff0)) + 8);
    auVar54 = auVar54 ^ *(undefined1 (*) [16])(puVar7 + (auVar69._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x40) = auVar87;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x50) = auVar22;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x60) = auVar38;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x70) = auVar54;
    uVar97 = auVar87._4_4_;
    auVar70._4_4_ = uVar97;
    auVar70._0_4_ = uVar97;
    auVar70._8_4_ = auVar87._12_4_;
    auVar70._12_4_ = auVar87._12_4_;
    auVar71._0_8_ =
         (ulong)uVar97 * (ulong)auVar87._0_4_ + *(long *)(puVar10 + (auVar87._0_8_ & 0xff0));
    auVar71._8_8_ =
         (auVar70._8_8_ & 0xffffffff) * (ulong)auVar87._8_4_ +
         *(long *)((long)(puVar10 + (auVar87._0_8_ & 0xff0)) + 8);
    auVar71 = auVar71 ^ *(undefined1 (*) [16])(puVar7 + (auVar87._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar22._4_4_;
    auVar88._4_4_ = uVar97;
    auVar88._0_4_ = uVar97;
    auVar88._8_4_ = auVar22._12_4_;
    auVar88._12_4_ = auVar22._12_4_;
    auVar89._0_8_ =
         (ulong)uVar97 * (ulong)auVar22._0_4_ + *(long *)(puVar10 + (auVar22._0_8_ & 0xff0));
    auVar89._8_8_ =
         (auVar88._8_8_ & 0xffffffff) * (ulong)auVar22._8_4_ +
         *(long *)((long)(puVar10 + (auVar22._0_8_ & 0xff0)) + 8);
    auVar89 = auVar89 ^ *(undefined1 (*) [16])(puVar7 + (auVar22._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar38._4_4_;
    auVar107._4_4_ = uVar97;
    auVar107._0_4_ = uVar97;
    auVar107._8_4_ = auVar38._12_4_;
    auVar107._12_4_ = auVar38._12_4_;
    auVar108._0_8_ =
         (ulong)uVar97 * (ulong)auVar38._0_4_ + *(long *)(puVar10 + (auVar38._0_8_ & 0xff0));
    auVar108._8_8_ =
         (auVar107._8_8_ & 0xffffffff) * (ulong)auVar38._8_4_ +
         *(long *)((long)(puVar10 + (auVar38._0_8_ & 0xff0)) + 8);
    auVar108 = auVar108 ^ *(undefined1 (*) [16])(puVar7 + (auVar38._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar54._4_4_;
    auVar123._4_4_ = uVar97;
    auVar123._0_4_ = uVar97;
    auVar123._8_4_ = auVar54._12_4_;
    auVar123._12_4_ = auVar54._12_4_;
    auVar124._0_8_ =
         (ulong)uVar97 * (ulong)auVar54._0_4_ + *(long *)(puVar10 + (auVar54._0_8_ & 0xff0));
    auVar124._8_8_ =
         (auVar123._8_8_ & 0xffffffff) * (ulong)auVar54._8_4_ +
         *(long *)((long)(puVar10 + (auVar54._0_8_ & 0xff0)) + 8);
    auVar124 = auVar124 ^ *(undefined1 (*) [16])(puVar7 + (auVar54._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x80) = auVar71;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x90) = auVar89;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xa0) = auVar108;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xb0) = auVar124;
    uVar97 = auVar71._4_4_;
    auVar39._4_4_ = uVar97;
    auVar39._0_4_ = uVar97;
    auVar39._8_4_ = auVar71._12_4_;
    auVar39._12_4_ = auVar71._12_4_;
    auVar40._0_8_ =
         (ulong)uVar97 * (ulong)auVar71._0_4_ + *(long *)(puVar10 + (auVar71._0_8_ & 0xff0));
    auVar40._8_8_ =
         (auVar39._8_8_ & 0xffffffff) * (ulong)auVar71._8_4_ +
         *(long *)((long)(puVar10 + (auVar71._0_8_ & 0xff0)) + 8);
    auVar40 = auVar40 ^ *(undefined1 (*) [16])(puVar7 + (auVar71._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar89._4_4_;
    auVar23._4_4_ = uVar97;
    auVar23._0_4_ = uVar97;
    auVar23._8_4_ = auVar89._12_4_;
    auVar23._12_4_ = auVar89._12_4_;
    auVar24._0_8_ =
         (ulong)uVar97 * (ulong)auVar89._0_4_ + *(long *)(puVar10 + (auVar89._0_8_ & 0xff0));
    auVar24._8_8_ =
         (auVar23._8_8_ & 0xffffffff) * (ulong)auVar89._8_4_ +
         *(long *)((long)(puVar10 + (auVar89._0_8_ & 0xff0)) + 8);
    auVar24 = auVar24 ^ *(undefined1 (*) [16])(puVar7 + (auVar89._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar108._4_4_;
    auVar55._4_4_ = uVar97;
    auVar55._0_4_ = uVar97;
    auVar55._8_4_ = auVar108._12_4_;
    auVar55._12_4_ = auVar108._12_4_;
    auVar56._0_8_ =
         (ulong)uVar97 * (ulong)auVar108._0_4_ + *(long *)(puVar10 + (auVar108._0_8_ & 0xff0));
    auVar56._8_8_ =
         (auVar55._8_8_ & 0xffffffff) * (ulong)auVar108._8_4_ +
         *(long *)((long)(puVar10 + (auVar108._0_8_ & 0xff0)) + 8);
    auVar56 = auVar56 ^ *(undefined1 (*) [16])(puVar7 + (auVar108._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar124._4_4_;
    auVar90._4_4_ = uVar97;
    auVar90._0_4_ = uVar97;
    auVar90._8_4_ = auVar124._12_4_;
    auVar90._12_4_ = auVar124._12_4_;
    auVar91._0_8_ =
         (ulong)uVar97 * (ulong)auVar124._0_4_ + *(long *)(puVar10 + (auVar124._0_8_ & 0xff0));
    auVar91._8_8_ =
         (auVar90._8_8_ & 0xffffffff) * (ulong)auVar124._8_4_ +
         *(long *)((long)(puVar10 + (auVar124._0_8_ & 0xff0)) + 8);
    auVar91 = auVar91 ^ *(undefined1 (*) [16])(puVar7 + (auVar124._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xc0) = auVar40;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xd0) = auVar24;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xe0) = auVar56;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xf0) = auVar91;
    uVar97 = auVar40._4_4_;
    auVar72._4_4_ = uVar97;
    auVar72._0_4_ = uVar97;
    auVar72._8_4_ = auVar40._12_4_;
    auVar72._12_4_ = auVar40._12_4_;
    auVar59._0_8_ =
         (ulong)uVar97 * (ulong)auVar40._0_4_ + *(long *)(puVar10 + (auVar40._0_8_ & 0xff0));
    auVar59._8_8_ =
         (auVar72._8_8_ & 0xffffffff) * (ulong)auVar40._8_4_ +
         *(long *)((long)(puVar10 + (auVar40._0_8_ & 0xff0)) + 8);
    auVar59 = auVar59 ^ *(undefined1 (*) [16])(puVar7 + (auVar40._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar24._4_4_;
    auVar41._4_4_ = uVar97;
    auVar41._0_4_ = uVar97;
    auVar41._8_4_ = auVar24._12_4_;
    auVar41._12_4_ = auVar24._12_4_;
    auVar26._0_8_ =
         (ulong)uVar97 * (ulong)auVar24._0_4_ + *(long *)(puVar10 + (auVar24._0_8_ & 0xff0));
    auVar26._8_8_ =
         (auVar41._8_8_ & 0xffffffff) * (ulong)auVar24._8_4_ +
         *(long *)((long)(puVar10 + (auVar24._0_8_ & 0xff0)) + 8);
    auVar26 = auVar26 ^ *(undefined1 (*) [16])(puVar7 + (auVar24._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar56._4_4_;
    auVar25._4_4_ = uVar97;
    auVar25._0_4_ = uVar97;
    auVar25._8_4_ = auVar56._12_4_;
    auVar25._12_4_ = auVar56._12_4_;
    auVar14._0_8_ =
         (ulong)uVar97 * (ulong)auVar56._0_4_ + *(long *)(puVar10 + (auVar56._0_8_ & 0xff0));
    auVar14._8_8_ =
         (auVar25._8_8_ & 0xffffffff) * (ulong)auVar56._8_4_ +
         *(long *)((long)(puVar10 + (auVar56._0_8_ & 0xff0)) + 8);
    auVar14 = auVar14 ^ *(undefined1 (*) [16])(puVar7 + (auVar56._0_8_ >> 0x20 & 0xff0));
    uVar97 = auVar91._4_4_;
    auVar57._4_4_ = uVar97;
    auVar57._0_4_ = uVar97;
    auVar57._8_4_ = auVar91._12_4_;
    auVar57._12_4_ = auVar91._12_4_;
    auVar42._0_8_ =
         (ulong)uVar97 * (ulong)auVar91._0_4_ + *(long *)(puVar10 + (auVar91._0_8_ & 0xff0));
    auVar42._8_8_ =
         (auVar57._8_8_ & 0xffffffff) * (ulong)auVar91._8_4_ +
         *(long *)((long)(puVar10 + (auVar91._0_8_ & 0xff0)) + 8);
    auVar42 = auVar42 ^ *(undefined1 (*) [16])(puVar7 + (auVar91._0_8_ >> 0x20 & 0xff0));
    sVar8 = (size_t)((int)sVar8 + 0x200U & 0xff0);
    if (r * 2 - 2 <= uVar9) break;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x30) = auVar59;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x20) = auVar26;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x10) = auVar14;
    *(undefined1 (*) [16])((long)Bout + lVar6) = auVar42;
    uVar9 = uVar9 + 2;
    lVar6 = lVar6 + 0x80;
    puVar5 = puVar12;
    puVar12 = puVar10;
  }
  ctx->S0 = puVar12;
  ctx->S1 = puVar10;
  ctx->S2 = puVar7;
  ctx->w = sVar8;
  iVar58 = auVar59._0_4_;
  uVar97 = auVar42._0_4_ + iVar58;
  iVar73 = auVar59._4_4_;
  uVar111 = auVar42._4_4_ + iVar73;
  iVar74 = auVar59._8_4_;
  uVar112 = auVar42._8_4_ + iVar74;
  iVar75 = auVar59._12_4_;
  uVar113 = auVar42._12_4_ + iVar75;
  auVar92._0_4_ = uVar97 >> 0x19;
  auVar92._4_4_ = uVar111 >> 0x19;
  auVar92._8_4_ = uVar112 >> 0x19;
  auVar92._12_4_ = uVar113 >> 0x19;
  auVar109._0_4_ = uVar97 * 0x80;
  auVar109._4_4_ = uVar111 * 0x80;
  auVar109._8_4_ = uVar112 * 0x80;
  auVar109._12_4_ = uVar113 * 0x80;
  auVar77 = (auVar109 | auVar92) ^ auVar26;
  uVar114 = auVar77._0_4_;
  uVar128 = auVar77._4_4_;
  uVar129 = auVar77._8_4_;
  uVar131 = auVar77._12_4_;
  auVar93._0_4_ = uVar114 + iVar58 >> 0x17;
  auVar93._4_4_ = uVar128 + iVar73 >> 0x17;
  auVar93._8_4_ = uVar129 + iVar74 >> 0x17;
  auVar93._12_4_ = uVar131 + iVar75 >> 0x17;
  auVar125._0_4_ = (uVar114 + iVar58) * 0x200;
  auVar125._4_4_ = (uVar128 + iVar73) * 0x200;
  auVar125._8_4_ = (uVar129 + iVar74) * 0x200;
  auVar125._12_4_ = (uVar131 + iVar75) * 0x200;
  auVar98 = (auVar125 | auVar93) ^ auVar14;
  iVar76 = auVar98._0_4_;
  iVar96 = auVar98._4_4_;
  uVar97 = auVar98._8_4_ + uVar129;
  uVar111 = auVar98._12_4_ + uVar131;
  auVar136._0_4_ = iVar76 + uVar114 >> 0x13;
  auVar136._4_4_ = iVar96 + uVar128 >> 0x13;
  auVar136._8_4_ = uVar97 >> 0x13;
  auVar136._12_4_ = uVar111 >> 0x13;
  auVar94._0_4_ = (iVar76 + uVar114) * 0x2000;
  auVar94._4_4_ = (iVar96 + uVar128) * 0x2000;
  auVar94._8_4_ = uVar97 * 0x2000;
  auVar94._12_4_ = uVar111 * 0x2000;
  auVar77 = (auVar94 | auVar136) ^ auVar42;
  auVar139._0_12_ = auVar77._4_12_;
  auVar139._12_4_ = auVar77._0_4_;
  uVar97 = auVar77._0_4_ + iVar76;
  uVar111 = auVar77._4_4_ + iVar96;
  uVar112 = auVar77._8_4_ + auVar98._8_4_;
  uVar113 = auVar77._12_4_ + auVar98._12_4_;
  auVar137._0_4_ = uVar97 >> 0xe;
  auVar137._4_4_ = uVar111 >> 0xe;
  auVar137._8_4_ = uVar112 >> 0xe;
  auVar137._12_4_ = uVar113 >> 0xe;
  auVar95._0_4_ = uVar97 * 0x40000;
  auVar95._4_4_ = uVar111 * 0x40000;
  auVar95._8_4_ = uVar112 * 0x40000;
  auVar95._12_4_ = uVar113 * 0x40000;
  auVar126._0_8_ = auVar98._8_8_;
  auVar126._8_4_ = iVar76;
  auVar126._12_4_ = iVar96;
  auVar59 = (auVar95 | auVar137) ^ auVar59;
  uVar97 = uVar131 + auVar59._0_4_;
  uVar111 = uVar114 + auVar59._4_4_;
  uVar112 = uVar128 + auVar59._8_4_;
  uVar113 = uVar129 + auVar59._12_4_;
  auVar144._0_4_ = uVar97 * 0x80;
  auVar144._4_4_ = uVar111 * 0x80;
  auVar144._8_4_ = uVar112 * 0x80;
  auVar144._12_4_ = uVar113 * 0x80;
  auVar110._0_4_ = uVar97 >> 0x19;
  auVar110._4_4_ = uVar111 >> 0x19;
  auVar110._8_4_ = uVar112 >> 0x19;
  auVar110._12_4_ = uVar113 >> 0x19;
  auVar110 = auVar110 ^ auVar144 ^ auVar139;
  iVar138 = auVar110._0_4_;
  uVar97 = iVar138 + auVar59._0_4_;
  iVar141 = auVar110._4_4_;
  uVar111 = iVar141 + auVar59._4_4_;
  iVar142 = auVar110._8_4_;
  iVar143 = auVar110._12_4_;
  uVar112 = iVar142 + auVar59._8_4_;
  uVar113 = iVar143 + auVar59._12_4_;
  auVar145._0_4_ = uVar97 * 0x200;
  auVar145._4_4_ = uVar111 * 0x200;
  auVar145._8_4_ = uVar112 * 0x200;
  auVar145._12_4_ = uVar113 * 0x200;
  auVar140._0_4_ = uVar97 >> 0x17;
  auVar140._4_4_ = uVar111 >> 0x17;
  auVar140._8_4_ = uVar112 >> 0x17;
  auVar140._12_4_ = uVar113 >> 0x17;
  auVar140 = auVar140 ^ auVar145 ^ auVar126;
  iVar76 = auVar140._0_4_;
  iVar96 = auVar140._4_4_;
  iVar130 = auVar140._8_4_;
  iVar132 = auVar140._12_4_;
  uVar131 = ((iVar76 + iVar138) * 0x2000 | (uint)(iVar76 + iVar138) >> 0x13) ^ uVar131;
  uVar114 = ((iVar96 + iVar141) * 0x2000 | (uint)(iVar96 + iVar141) >> 0x13) ^ uVar114;
  uVar128 = ((iVar130 + iVar142) * 0x2000 | (uint)(iVar130 + iVar142) >> 0x13) ^ uVar128;
  uVar129 = ((iVar132 + iVar143) * 0x2000 | (uint)(iVar132 + iVar143) >> 0x13) ^ uVar129;
  uVar97 = uVar131 + iVar76;
  uVar111 = uVar114 + iVar96;
  uVar112 = uVar128 + iVar130;
  uVar113 = uVar129 + iVar132;
  auVar146._0_4_ = uVar97 >> 0xe;
  auVar146._4_4_ = uVar111 >> 0xe;
  auVar146._8_4_ = uVar112 >> 0xe;
  auVar146._12_4_ = uVar113 >> 0xe;
  auVar127._0_4_ = uVar97 * 0x40000;
  auVar127._4_4_ = uVar111 * 0x40000;
  auVar127._8_4_ = uVar112 * 0x40000;
  auVar127._12_4_ = uVar113 * 0x40000;
  auVar59 = (auVar127 | auVar146) ^ auVar59;
  uVar115 = auVar59._0_4_ + iVar58;
  puVar3 = (uint32_t *)((long)Bout + lVar6 + -0x30);
  *puVar3 = uVar115;
  puVar3[1] = auVar59._4_4_ + iVar73;
  puVar3[2] = auVar59._8_4_ + iVar74;
  puVar3[3] = auVar59._12_4_ + iVar75;
  piVar4 = (int *)((long)Bout + lVar6 + -0x20);
  *piVar4 = uVar114 + auVar26._0_4_;
  piVar4[1] = uVar128 + auVar26._4_4_;
  piVar4[2] = uVar129 + auVar26._8_4_;
  piVar4[3] = uVar131 + auVar26._12_4_;
  piVar4 = (int *)((long)Bout + lVar6 + -0x10);
  *piVar4 = iVar130 + auVar14._0_4_;
  piVar4[1] = iVar132 + auVar14._4_4_;
  piVar4[2] = iVar76 + auVar14._8_4_;
  piVar4[3] = iVar96 + auVar14._12_4_;
  piVar4 = (int *)((long)Bout + lVar6);
  *piVar4 = iVar143 + auVar42._0_4_;
  piVar4[1] = iVar138 + auVar42._4_4_;
  piVar4[2] = iVar141 + auVar42._8_4_;
  piVar4[3] = iVar142 + auVar42._12_4_;
  return uVar115;
}

Assistant:

static uint32_t
blockmix_xor_save(const salsa20_blk_t *restrict Bin1,
    salsa20_blk_t *restrict Bin2, salsa20_blk_t *restrict Bout,
    size_t r, pwxform_ctx_t *restrict ctx)
{
	__m128i X0, X1, X2, X3, Y0, Y1, Y2, Y3;
	uint8_t *S0 = ctx->S0, *S1 = ctx->S1, *S2 = ctx->S2;
	size_t w = ctx->w;
	size_t i;

	/* Convert 128-byte blocks to 64-byte blocks */
	/* 1: r_1 <-- 128r / PWXbytes */
	r *= 2;

	r--;
	PREFETCH(&Bin2[r], _MM_HINT_T0)
	PREFETCH(&Bin1[r], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin2[i], _MM_HINT_T0)
		PREFETCH(&Bin1[i], _MM_HINT_T0)
	}

	/* 2: X <-- B'_{r_1 - 1} */
	XOR4_2(Bin1[r].q, Bin2[r].q)

	/* 3: for i = 0 to r_1 - 1 do */
	i = 0;
	r--;
	do {
		XOR4(Bin1[i].q, Bin2[i].q)
		/* 5: X <-- X \xor B'_i */
		XOR4_Y
		/* 7: X <-- pwxform(X) */
		PWXFORM
		/* 8: B'_i <-- X */
		OUT(Bout[i].q)

		XOR4(Bin1[i + 1].q, Bin2[i + 1].q)
		/* 5: X <-- X \xor B'_i */
		XOR4_Y
		/* 7: X <-- pwxform(X) */
		PWXFORM

		if (unlikely(i >= r))
			break;

		/* 8: B'_i <-- X */
		OUT(Bout[i + 1].q)

		i += 2;
	} while (1);
	i++;

	ctx->S0 = S0; ctx->S1 = S1; ctx->S2 = S2;
	ctx->w = w;

	/* 11: B_i <-- H(B_i) */
	SALSA20_2(Bout[i].q)

	return _mm_cvtsi128_si32(X0);
}